

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

double __thiscall phyr::Sphere::solidAngle(Sphere *this,Point3f *p,int nSamples)

{
  double dVar1;
  double dVar2;
  Point3f pCenter;
  Point3<double> local_50;
  Point3<double> local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  Transform::operator()((this->super_Shape).localToWorld,&local_38);
  dVar1 = distanceSquared<double>(p,&local_50);
  dVar2 = this->radius * this->radius;
  if (dVar1 <= dVar2) {
    dVar1 = 12.566370614359172;
  }
  else {
    dVar1 = distanceSquared<double>(p,&local_50);
    dVar1 = 1.0 - dVar2 / dVar1;
    if (dVar1 <= 0.0) {
      dVar1 = 0.0;
    }
    dVar1 = (1.0 - SQRT(dVar1)) * 6.283185307179586;
  }
  return dVar1;
}

Assistant:

Real Sphere::solidAngle(const Point3f& p, int nSamples) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    if (distanceSquared(p, pCenter) <= radius * radius) return 4 * Pi;

    Real sinTheta2 = radius * radius / distanceSquared(p, pCenter);
    Real cosTheta = std::sqrt(std::max((Real)0, 1 - sinTheta2));
    return (2 * Pi * (1 - cosTheta));
}